

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket_client_transporter.cpp
# Opt level: O0

void __thiscall SocketClientTransporter::SocketClientTransporter(SocketClientTransporter *this)

{
  SocketClientTransporter *this_local;
  
  Transporter::Transporter(&this->super_Transporter,false);
  (this->super_Transporter)._vptr_Transporter = (_func_int **)&PTR__SocketClientTransporter_00267368
  ;
  memset(&this->uvClient,0,0xf8);
  memset(&this->connect_req,0,0x60);
  std::mutex::mutex(&this->mutex);
  std::condition_variable::condition_variable(&this->cv);
  this->connectionStatus = 0;
  return;
}

Assistant:

SocketClientTransporter::SocketClientTransporter():
	Transporter(false),
	uvClient({}),
	connect_req({}),
	connectionStatus(0) {
}